

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_format.cpp
# Opt level: O0

bool UnformatImage(string *path,Range range)

{
  bool bVar1;
  int def_cyls;
  int def_heads;
  element_type *peVar2;
  anon_class_8_1_898aba9b local_70;
  function<void_(const_CylHead_&)> local_68;
  undefined4 local_48;
  undefined1 local_38 [8];
  shared_ptr<Disk> disk;
  string *path_local;
  Range range_local;
  
  range_local._0_8_ = range._8_8_;
  register0x00000030 = range._0_8_;
  disk.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)path;
  std::make_shared<Disk>();
  bVar1 = ReadImage((string *)
                    disk.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
                    (shared_ptr<Disk> *)local_38,true);
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_38);
    def_cyls = Disk::cyls(peVar2);
    peVar2 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_38);
    def_heads = Disk::heads(peVar2);
    ValidateRange((Range *)((long)&path_local + 4),0x80,2,1,def_cyls,def_heads);
    local_70.disk = (shared_ptr<Disk> *)local_38;
    std::function<void(CylHead_const&)>::
    function<UnformatImage(std::__cxx11::string_const&,Range)::__0,void>
              ((function<void(CylHead_const&)> *)&local_68,&local_70);
    Range::each((Range *)((long)&path_local + 4),&local_68,false);
    std::function<void_(const_CylHead_&)>::~function(&local_68);
    range_local.head_begin._3_1_ =
         WriteImage((string *)
                    disk.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
                    (shared_ptr<Disk> *)local_38);
  }
  else {
    range_local.head_begin._3_1_ = false;
  }
  local_48 = 1;
  std::shared_ptr<Disk>::~shared_ptr((shared_ptr<Disk> *)local_38);
  return (bool)(range_local.head_begin._3_1_ & 1);
}

Assistant:

bool UnformatImage(const std::string& path, Range range)
{
    auto disk = std::make_shared<Disk>();
    if (!ReadImage(path, disk))
        return false;

    ValidateRange(range, MAX_TRACKS, MAX_SIDES, 1, disk->cyls(), disk->heads());

    range.each([&](const CylHead& cylhead) {
        Message(msgStatus, "Unformatting %s", CH(cylhead.cyl, cylhead.head));
        disk->write(cylhead, Track());
        });

    return WriteImage(path, disk);
}